

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void gen_laguerre_ss_compute(int order,double alpha,double *xtab,double *weight)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  double local_80;
  double xval;
  double ratio;
  double r2;
  double r1;
  double prod;
  double p1;
  double dStack_48;
  int i;
  double dp2;
  double cc;
  double *c;
  double *b;
  double *weight_local;
  double *xtab_local;
  double alpha_local;
  int order_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)order;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  b = weight;
  weight_local = xtab;
  xtab_local = (double *)alpha;
  alpha_local._4_4_ = order;
  c = (double *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)alpha_local._4_4_;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  cc = (double)operator_new__(uVar3);
  for (p1._4_4_ = 0; p1._4_4_ < alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    c[p1._4_4_] = (double)xtab_local + (double)(p1._4_4_ * 2 + 1);
  }
  for (p1._4_4_ = 0; p1._4_4_ < alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    *(double *)((long)cc + (long)p1._4_4_ * 8) =
         (double)p1._4_4_ * ((double)xtab_local + (double)p1._4_4_);
  }
  r1 = 1.0;
  for (p1._4_4_ = 1; p1._4_4_ < alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    r1 = r1 * *(double *)((long)cc + (long)p1._4_4_ * 8);
  }
  dVar4 = tgamma((double)xtab_local + 1.0);
  dp2 = dVar4 * r1;
  for (p1._4_4_ = 0; p1._4_4_ < alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
    if (p1._4_4_ == 0) {
      local_80 = (((double)xtab_local + 1.0) * ((double)xtab_local * 0.92 + 3.0)) /
                 ((double)xtab_local * 1.8 + (double)alpha_local._4_4_ * 2.4 + 1.0);
    }
    else {
      if (p1._4_4_ == 1) {
        dVar4 = ((double)xtab_local * 6.25 + 15.0) /
                ((double)alpha_local._4_4_ * 2.5 + (double)xtab_local * 0.9 + 1.0);
      }
      else {
        r2 = ((double)(p1._4_4_ + -1) * 2.55 + 1.0) / ((double)(p1._4_4_ + -1) * 1.9);
        ratio = ((double)(p1._4_4_ + -1) * 1.26 * (double)xtab_local) /
                ((double)(p1._4_4_ + -1) * 3.5 + 1.0);
        xval = (r2 + ratio) / ((double)xtab_local * 0.3 + 1.0);
        dVar4 = xval * (local_80 - weight_local[p1._4_4_ + -2]);
      }
      local_80 = local_80 + dVar4;
    }
    gen_laguerre_ss_root
              (&local_80,alpha_local._4_4_,(double)xtab_local,&stack0xffffffffffffffb8,&prod,c,
               (double *)cc);
    weight_local[p1._4_4_] = local_80;
    b[p1._4_4_] = (dp2 / dStack_48) / prod;
  }
  if (c != (double *)0x0) {
    operator_delete__(c);
  }
  if (cc != 0.0) {
    operator_delete__((void *)cc);
  }
  return;
}

Assistant:

void gen_laguerre_ss_compute ( int order, double alpha, double xtab[], 
  double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_LAGUERRE_SS_COMPUTE computes a generalized Gauss-Laguerre quadrature rule.
//
//  Discussion:
//
//    In the simplest case, ALPHA is 0, and we are approximating the
//    integral from 0 to +oo of exp(-X) * F(X).  When this is so,
//    it is easy to modify the rule to approximate the integral from
//    A to +oo as well.
//
//    If ALPHA is nonzero, then there is no simple way to extend the
//    rule to approximate the integral from A to +oo.  The simplest
//    procedures would be to approximate the integral from 0 to A.
//
//    If the integral is:
//
//        Integral ( A <= X < +oo ) exp ( - X ) * F(X) dX
//      or
//        Integral ( 0 <= X < +oo ) exp ( - X ) * X^ALPHA * F(X) dX
//
//    then the quadrature rule is:
//
//      EXP ( - A ) * Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( A+XTAB(I) )
//    or
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//
//    If the integral is:
//
//        Integral ( A <= X < +oo ) F(X) dX
//      or
//        Integral ( 0 <= X < +oo ) X^ALPHA * F(X) dX
//
//    then the quadrature rule is:
//
//      exp ( - A ) * Sum ( 1 <= I <= ORDER ) 
//        WEIGHT(I) * exp(A+XTAB(I)) * F ( A+XTAB(I) )
//    or
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * exp(XTAB(I)) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the quadrature rule to be computed.
//    ORDER must be at least 1.
//
//    Input, double ALPHA, the exponent of the X factor.
//    Set ALPHA = 0.0 for the simplest rule.
//    ALPHA must be nonnegative.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double *b;
  double *c;
  double cc;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double r2;
  double ratio;
  double xval;

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 0; i < order; i++ )
  {
    b[i] = ( alpha + double( 2 * i + 1 ) );
  }

  for ( i = 0; i < order; i++ )
  {
    c[i] = double( i ) * ( alpha + double( i ) );
  }
  prod = 1.0;
  for ( i = 1; i < order; i++ )
  {
    prod = prod * c[i];
  }
  cc = tgamma ( alpha + 1.0 ) * prod;

  for ( i = 0; i < order; i++ )
  {
//
//  Compute an estimate for the root.
//
    if ( i == 0 )
    {
      xval = ( 1.0 + alpha ) * ( 3.0+ 0.92 * alpha ) / 
        ( 1.0 + 2.4 * double( order ) + 1.8 * alpha );
    }
    else if ( i == 1 )
    {
      xval = xval + ( 15.0 + 6.25 * alpha ) / 
        ( 1.0 + 0.9 * alpha + 2.5 * double( order ) );
    }
    else
    {
      r1 = ( 1.0 + 2.55 * double( i - 1 ) ) 
        / ( 1.9 * double( i - 1 ) );

      r2 = 1.26 * double( i - 1 ) * alpha / 
        ( 1.0 + 3.5 * double( i - 1 ) );

      ratio = ( r1 + r2 ) / ( 1.0 + 0.3 * alpha );

      xval = xval + ratio * ( xval - xtab[i-2] );
    }
//
//  Use iteration to find the root.
//
    gen_laguerre_ss_root ( &xval, order, alpha, &dp2, &p1, b, c );
//
//  Set the abscissa and weight.
//
    xtab[i] = xval;
    weight[i] = ( cc / dp2 ) / p1;
  }

  delete [] b;
  delete [] c;

  return;
}